

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

bool_t bf_put_int8(bfile_t *bfile,int8_t value)

{
  undefined1 in_SIL;
  long in_RDI;
  int bufpos;
  int8_t *buffer;
  undefined7 in_stack_fffffffffffffff0;
  
  if ((ulong)*(uint *)(in_RDI + 0x38) <=
      (ulong)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x20))) {
    bf_write_buffer((bfile_t *)CONCAT17(in_SIL,in_stack_fffffffffffffff0));
  }
  *(undefined1 *)
   (*(long *)(in_RDI + 0x30) +
   (long)(int)(*(ulong *)(in_RDI + 0x18) % (ulong)*(uint *)(in_RDI + 0x38))) = in_SIL;
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
  return 1;
}

Assistant:

bool_t
bf_put_int8(
    bfile_t * bfile,
    int8_t value )
{
    int8_t * buffer;
    int bufpos;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    if ( (bfile->pos - bfile->ipos) >= bfile->buffer_size ) 
        bf_write_buffer( bfile );

    buffer = (int8_t *) bfile->buffer;
    bufpos = bfile->pos % bfile->buffer_size;
    buffer[bufpos] = (value & 0xff);
    bfile->pos++;
    return TRUE;
}